

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-xml-parser.c
# Opt level: O0

int coda_xml_parse(coda_xml_product *product)

{
  XML_Status XVar1;
  XML_Error code;
  int iVar2;
  coda_type_record *definition_00;
  __off_t _Var3;
  char *pcVar4;
  ssize_t sVar5;
  undefined4 *puVar6;
  int *piVar7;
  XML_LChar *pXVar8;
  XML_Index a;
  XML_Size XVar9;
  bool local_24c9;
  char local_24c8 [8];
  char s [21];
  char local_24a8 [8];
  char byte_offset_str [21];
  int local_2484;
  int result;
  int length;
  char *buff_ptr;
  coda_type_record *definition;
  long i;
  long num_blocks;
  parser_info_conflict info;
  char buff [8192];
  coda_xml_product *product_local;
  
  parser_info_init((parser_info_conflict *)&num_blocks);
  num_blocks = (long)coda_XML_ParserCreateNS((XML_Char *)0x0,' ');
  if ((XML_Parser)num_blocks == (XML_Parser)0x0) {
    coda_set_error(-0xe,"could not create XML parser");
    product_local._4_4_ = -1;
  }
  else {
    local_24c9 = true;
    if (product->product_definition != (coda_product_definition *)0x0) {
      local_24c9 = product->product_definition->root_type == (coda_type *)0x0;
    }
    info.attributes._0_4_ = (uint)local_24c9;
    info._8_8_ = product;
    if ((uint)info.attributes == 0) {
      if (product->product_definition->root_type->type_class != coda_record_class) {
        __assert_fail("product->product_definition->root_type->type_class == coda_record_class",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                      ,0x30f,"int coda_xml_parse(coda_xml_product *)");
      }
      if (*(int *)&product->product_definition->root_type[1].size_expr != 0) {
        __assert_fail("!((coda_type_record *)product->product_definition->root_type)->is_union",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                      ,0x310,"int coda_xml_parse(coda_xml_product *)");
      }
      info.definition[0x1f] =
           (coda_type **)
           coda_mem_record_new((coda_type_record *)product->product_definition->root_type,
                               (coda_dynamic_type *)0x0);
    }
    else {
      definition_00 = coda_type_record_new(coda_format_xml);
      if (definition_00 == (coda_type_record *)0x0) {
        coda_XML_ParserFree((XML_Parser)num_blocks);
        return -1;
      }
      info.definition[0x1f] =
           (coda_type **)coda_mem_record_new(definition_00,(coda_dynamic_type *)0x0);
      coda_type_release((coda_type *)definition_00);
    }
    if (info.definition[0x1f] == (coda_type **)0x0) {
      parser_info_cleanup((parser_info_conflict *)&num_blocks);
      product_local._4_4_ = -1;
    }
    else {
      info._24_8_ = info.definition[0x1f] + 1;
      info.record[0x1f] = (coda_mem_record *)0xffffffffffffffff;
      info.index[0x1f] = 0;
      info.product._0_4_ = 0;
      coda_XML_SetUserData((XML_Parser)num_blocks,&num_blocks);
      coda_XML_SetParamEntityParsing((XML_Parser)num_blocks,XML_PARAM_ENTITY_PARSING_ALWAYS);
      coda_XML_SetElementHandler((XML_Parser)num_blocks,start_element_handler,end_element_handler);
      coda_XML_SetCharacterDataHandler((XML_Parser)num_blocks,character_data_handler);
      coda_XML_SetNotStandaloneHandler((XML_Parser)num_blocks,not_standalone_handler);
      i = product->raw_product->file_size / 0x2000;
      if (i * 0x2000 < product->raw_product->file_size) {
        i = i + 1;
      }
      for (definition = (coda_type_record *)0x0; (long)definition < i;
          definition = (coda_type_record *)((long)&definition->format + 1)) {
        if (*(int *)&product->raw_product[1].filename == 0) {
          _Var3 = lseek(*(int *)((long)&product->raw_product[1].filename + 4),
                        (long)definition << 0xd,0);
          if (_Var3 < 0) {
            coda_str64((long)definition << 0xd,local_24a8);
            piVar7 = __errno_location();
            pcVar4 = strerror(*piVar7);
            coda_set_error(-0x16,"could not move to byte position %s (%s)",local_24a8,pcVar4);
            parser_info_cleanup((parser_info_conflict *)&num_blocks);
            return -1;
          }
          sVar5 = read(*(int *)((long)&product->raw_product[1].filename + 4),&info.value,0x2000);
          local_2484 = (int)sVar5;
          if (local_2484 < 0) {
            piVar7 = __errno_location();
            pcVar4 = strerror(*piVar7);
            coda_set_error(-0x16,"could not read from file (%s)",pcVar4);
            parser_info_cleanup((parser_info_conflict *)&num_blocks);
            return -1;
          }
          _result = &info.value;
        }
        else {
          if ((long)definition < i + -1) {
            local_2484 = 0x2000;
          }
          else {
            local_2484 = (int)product->raw_product->file_size + ((int)i + -1) * -0x2000;
          }
          _result = (char **)(product->raw_product->mem_ptr + (long)definition * 0x2000);
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_00246fb8);
        *puVar6 = 0;
        XVar1 = coda_XML_Parse((XML_Parser)num_blocks,(char *)_result,local_2484,
                               (uint)(definition == (coda_type_record *)(i + -1)));
        if ((XVar1 == XML_STATUS_ERROR) ||
           (piVar7 = (int *)__tls_get_addr(&PTR_00246fb8), *piVar7 != 0)) {
          piVar7 = (int *)__tls_get_addr(&PTR_00246fb8);
          if (*piVar7 == 0) {
            code = coda_XML_GetErrorCode((XML_Parser)num_blocks);
            pXVar8 = coda_XML_ErrorString(code);
            coda_set_error(-0xe,"xml parse error: %s",pXVar8);
          }
          a = coda_XML_GetCurrentByteIndex((XML_Parser)num_blocks);
          coda_str64(a,local_24c8);
          XVar9 = coda_XML_GetCurrentLineNumber((XML_Parser)num_blocks);
          coda_add_error_message(" (line: %lu, byte offset: %s)",XVar9,local_24c8);
          parser_info_cleanup((parser_info_conflict *)&num_blocks);
          return -1;
        }
      }
      coda_XML_ParserFree((XML_Parser)num_blocks);
      num_blocks = 0;
      if (((uint)info.attributes == 0) ||
         (iVar2 = coda_mem_type_update
                            ((coda_dynamic_type **)(info.definition + 0x1f),info.definition[0x1f][1]
                            ), iVar2 == 0)) {
        product->root_type = (coda_dynamic_type *)info.definition[0x1f];
        info.product._0_4_ = 0xffffffff;
        parser_info_cleanup((parser_info_conflict *)&num_blocks);
        product_local._4_4_ = 0;
      }
      else {
        parser_info_cleanup((parser_info_conflict *)&num_blocks);
        product_local._4_4_ = -1;
      }
    }
  }
  return product_local._4_4_;
}

Assistant:

int coda_xml_parse(coda_xml_product *product)
{
    char buff[BUFFSIZE];
    parser_info info;
    long num_blocks;
    long i;

    parser_info_init(&info);
    info.parser = XML_ParserCreateNS(NULL, ' ');
    if (info.parser == NULL)
    {
        coda_set_error(CODA_ERROR_XML, "could not create XML parser");
        return -1;
    }
    info.product = product;
    info.update_definition = (product->product_definition == NULL || product->product_definition->root_type == NULL);
    /* the root of the product is always a record, which will contain the top-level xml element as a field */
    if (info.update_definition)
    {
        coda_type_record *definition;

        definition = coda_type_record_new(coda_format_xml);
        if (definition == NULL)
        {
            XML_ParserFree(info.parser);
            return -1;
        }
        info.record[0] = coda_mem_record_new(definition, NULL);
        coda_type_release((coda_type *)definition);
    }
    else
    {
        assert(product->product_definition->root_type->type_class == coda_record_class);
        assert(!((coda_type_record *)product->product_definition->root_type)->is_union);
        info.record[0] = coda_mem_record_new((coda_type_record *)product->product_definition->root_type, NULL);
    }
    if (info.record[0] == NULL)
    {
        parser_info_cleanup(&info);
        return -1;
    }
    info.definition[0] = (coda_type **)&info.record[0]->definition;
    info.index[0] = -1;
    info.xml_name[0] = NULL;
    info.depth = 0;

    XML_SetUserData(info.parser, &info);
    XML_SetParamEntityParsing(info.parser, XML_PARAM_ENTITY_PARSING_ALWAYS);
    XML_SetElementHandler(info.parser, start_element_handler, end_element_handler);
    XML_SetCharacterDataHandler(info.parser, character_data_handler);
    XML_SetNotStandaloneHandler(info.parser, not_standalone_handler);

    /* we also need to parse in blocks for mmap-ed files since the file size may exceed MAX_INT */
    num_blocks = (long)(product->raw_product->file_size / BUFFSIZE);
    if (product->raw_product->file_size > num_blocks * BUFFSIZE)
    {
        num_blocks++;
    }
    for (i = 0; i < num_blocks; i++)
    {
        const char *buff_ptr;
        int length;
        int result;

        if (((coda_bin_product *)product->raw_product)->use_mmap)
        {
            if (i < num_blocks - 1)
            {
                length = BUFFSIZE;
            }
            else
            {
                length = (int)(product->raw_product->file_size - (num_blocks - 1) * BUFFSIZE);
            }
            buff_ptr = (const char *)&(product->raw_product->mem_ptr[i * BUFFSIZE]);
        }
        else
        {
            if (lseek(((coda_bin_product *)product->raw_product)->fd, (off_t)i * BUFFSIZE, SEEK_SET) < 0)
            {
                char byte_offset_str[21];

                coda_str64(i * BUFFSIZE, byte_offset_str);
                coda_set_error(CODA_ERROR_FILE_READ, "could not move to byte position %s (%s)", byte_offset_str,
                               strerror(errno));
                parser_info_cleanup(&info);
                return -1;
            }
            length = read(((coda_bin_product *)product->raw_product)->fd, buff, BUFFSIZE);
            if (length < 0)
            {
                coda_set_error(CODA_ERROR_FILE_READ, "could not read from file (%s)", strerror(errno));
                parser_info_cleanup(&info);
                return -1;
            }
            buff_ptr = buff;
        }

        coda_errno = 0;
        result = XML_Parse(info.parser, buff_ptr, length, (i == num_blocks - 1));
        if (result == XML_STATUS_ERROR || coda_errno != 0)
        {
            char s[21];

            if (coda_errno == 0)
            {
                coda_set_error(CODA_ERROR_XML, "xml parse error: %s", XML_ErrorString(XML_GetErrorCode(info.parser)));
            }
            coda_str64(XML_GetCurrentByteIndex(info.parser), s);
            coda_add_error_message(" (line: %lu, byte offset: %s)", (long)XML_GetCurrentLineNumber(info.parser), s);
            parser_info_cleanup(&info);
            return -1;
        }
    }

    XML_ParserFree(info.parser);
    info.parser = NULL;

    if (info.update_definition)
    {
        if (coda_mem_type_update((coda_dynamic_type **)&info.record[0], (coda_type *)info.record[0]->definition) != 0)
        {
            parser_info_cleanup(&info);
            return -1;
        }
    }

    product->root_type = (coda_dynamic_type *)info.record[0];
    info.depth = -1;

    parser_info_cleanup(&info);

    return 0;
}